

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O3

bool google::protobuf::compiler::cpp::HasMapFields(FileDescriptor *file)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  
  if (*(int *)(file + 0x58) < 1) {
    return false;
  }
  lVar2 = 0;
  lVar3 = 0;
  do {
    bVar1 = HasMapFields((Descriptor *)(*(long *)(file + 0x60) + lVar2));
    if (bVar1) {
      return bVar1;
    }
    lVar3 = lVar3 + 1;
    lVar2 = lVar2 + 0xa8;
  } while (lVar3 < *(int *)(file + 0x58));
  return bVar1;
}

Assistant:

bool HasMapFields(const FileDescriptor* file) {
  for (int i = 0; i < file->message_type_count(); ++i) {
    if (HasMapFields(file->message_type(i))) return true;
  }
  return false;
}